

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

bool __thiscall units::precise_unit::operator==(precise_unit *this,precise_unit *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((other->base_units_ != this->base_units_) || (this->commodity_ != other->commodity_)) {
    return false;
  }
  dVar1 = this->multiplier_;
  dVar3 = other->multiplier_;
  if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
    dVar4 = dVar1 - dVar3;
    if (((dVar4 != 0.0) || (NAN(dVar4))) &&
       ((NAN(dVar4) || (0xffffffffffffe < (long)ABS(dVar4) - 1U)))) {
      dVar4 = (double)((long)dVar1 + 0x800U & 0xfffffffffffff000);
      dVar5 = (double)((long)dVar3 + 0x800U & 0xfffffffffffff000);
      if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
        dVar2 = (double)((long)(dVar3 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
        if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
          dVar3 = (double)((long)(dVar3 * 0.9999999999995) + 0x800U & 0xfffffffffffff000);
          if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
            dVar3 = (double)((long)(dVar1 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
            if ((dVar5 != dVar3) || (NAN(dVar5) || NAN(dVar3))) {
              return (bool)(-(dVar5 == (double)((long)(dVar1 * 0.9999999999995) + 0x800U &
                                               0xfffffffffffff000)) & 1);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }